

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_dump_ops_mips64el(TCGContext_conflict6 *s,_Bool have_prefs,char *headline)

{
  uint local_30;
  uint local_2c;
  int op_idx;
  int insn_idx;
  TCGOp *op;
  char *headline_local;
  _Bool have_prefs_local;
  TCGContext_conflict6 *s_local;
  
  local_2c = 0;
  local_30 = 0;
  fprintf(_stderr,"\n*** %s\n",headline);
  for (_op_idx = (s->ops).tqh_first; _op_idx != (TCGOp *)0x0; _op_idx = (_op_idx->link).tqe_next) {
    if (((undefined1  [120])*_op_idx & (undefined1  [120])0xff) == (undefined1  [120])0x81) {
      fprintf(_stderr,"\n insn_idx=%d",(ulong)local_2c);
      local_2c = local_2c + 1;
      local_30 = 0;
    }
    else {
      fprintf(_stderr," %d: ",(ulong)local_30);
    }
    local_30 = local_30 + 1;
    tcg_dump_op_mips64el(s,have_prefs,_op_idx);
  }
  return;
}

Assistant:

void tcg_dump_ops(TCGContext *s, bool have_prefs, const char *headline)
{
    TCGOp *op;
    int insn_idx = 0;
    int op_idx = 0;

    fprintf(stderr, "\n*** %s\n", headline);
    // tcg_dump_tbs(s, tcg_dump_tb, NULL);

    QTAILQ_FOREACH(op, &s->ops, link) {
        if (op->opc == INDEX_op_insn_start) {
            fprintf(stderr, "\n insn_idx=%d", insn_idx);
            insn_idx++;
            op_idx = 0;
        } else {
            fprintf(stderr, " %d: ", op_idx);
        }
        op_idx++;
        tcg_dump_op(s, have_prefs, op);
    }
}